

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O0

void __thiscall TexturesOnViewportEdge::TexturesOnViewportEdge(TexturesOnViewportEdge *this)

{
  TexturesOnViewportEdge *this_local;
  
  rengine::StaticRenderTest::StaticRenderTest(&this->super_StaticRenderTest);
  (this->super_StaticRenderTest)._vptr_StaticRenderTest = (_func_int **)&PTR_build_00164a58;
  return;
}

Assistant:

Node *build() override {
        vec2 s = surface()->size();
        Node *root = Node::create();
        *root
            // Top-left, 50% red
            << &(*OpacityNode::create(0.5) << RectangleNode::create(rect2d::fromXywh(-1, -1, 2, 2), vec4(1, 0, 0, 1)))
            // Top-right, 25% green
            << &(*OpacityNode::create(0.25) << RectangleNode::create(rect2d::fromXywh(s.x-1, -1, 2, 2), vec4(0, 1, 0, 1)))
            // Bottom-left, 75% blue
            << &(*OpacityNode::create(0.75) << RectangleNode::create(rect2d::fromXywh(-1, s.y-1, 2, 2), vec4(0, 0, 1, 1)))
            // Bottom-right,
            << &(*OpacityNode::create(0.5) << RectangleNode::create(rect2d::fromXywh(s.x-1, s.y-1, 2, 2), vec4(1, 1, 1, 1)))
            ;

        return root;
    }